

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lace.c
# Opt level: O0

void lace_steal_random_CALL(WorkerP *w,Task *__dq_head)

{
  ushort uVar1;
  Worker **ppWVar2;
  atomic<unsigned_int> aVar3;
  Task *__dq_head_local;
  WorkerP *w_local;
  Worker *res;
  Worker *victim;
  
  if (lace_newframe.t != (Task *)0x0) {
    lace_yield(w,__dq_head);
  }
  ppWVar2 = workers;
  if (external_task == (ExtTask *)0x0) {
    if (1 < n_workers) {
      uVar1 = w->worker;
      aVar3 = rng((atomic<unsigned_int> *)&w->seed,n_workers - 1);
      lace_steal(w,__dq_head,
                 ppWVar2[(ulong)(uVar1 + 1 + (int)aVar3.super___atomic_base<unsigned_int>._M_i) %
                         (ulong)n_workers]);
    }
  }
  else {
    lace_steal_external(w,__dq_head);
  }
  return;
}

Assistant:

VOID_TASK_0(lace_steal_random)
{
    YIELD_NEWFRAME();

    if (unlikely(atomic_load_explicit(&external_task, memory_order_acquire) != 0)) {
        lace_steal_external(__lace_worker, __lace_dq_head);
    } else if (n_workers > 1) {
        Worker *victim = workers[(__lace_worker->worker + 1 + rng(&__lace_worker->seed, n_workers-1)) % n_workers];

        PR_COUNTSTEALS(__lace_worker, CTR_steal_tries);
        Worker *res = lace_steal(__lace_worker, __lace_dq_head, victim);
        if (res == LACE_STOLEN) {
            PR_COUNTSTEALS(__lace_worker, CTR_steals);
        } else if (res == LACE_BUSY) {
            PR_COUNTSTEALS(__lace_worker, CTR_steal_busy);
        }
    }
}